

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O2

void UpnpThreadDistribution(UpnpNonblockParam *Param)

{
  UpnpClient_Handle UVar1;
  int iVar2;
  IXML_Document *in_RAX;
  UpnpString *PublisherURL;
  UpnpActionComplete *p;
  UpnpStateVarComplete *p_00;
  UpnpEventSubscribe *p_01;
  UpnpString *pUVar3;
  char *pcVar4;
  Upnp_EventType UStack_40;
  IXML_Document *actionResult;
  
  actionResult = in_RAX;
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xfb8,"Inside UpnpThreadDistribution \n");
  switch(Param->FunName) {
  case SUBSCRIBE:
    p_01 = UpnpEventSubscribe_new();
    pUVar3 = UpnpString_new();
    UpnpEventSubscribe_strcpy_PublisherUrl(p_01,Param->Url);
    UVar1 = Param->Handle;
    PublisherURL = UpnpEventSubscribe_get_PublisherUrl(p_01);
    iVar2 = genaSubscribe(UVar1,PublisherURL,&Param->TimeOut,pUVar3);
    UpnpEventSubscribe_set_ErrCode(p_01,iVar2);
    UpnpEventSubscribe_set_TimeOut(p_01,Param->TimeOut);
    UpnpEventSubscribe_set_SID(p_01,pUVar3);
    (*Param->Fun)(UPNP_EVENT_SUBSCRIBE_COMPLETE,p_01,Param->Cookie);
    UpnpString_delete(pUVar3);
    goto LAB_0010ff55;
  case UNSUBSCRIBE:
    p_01 = UpnpEventSubscribe_new();
    UpnpEventSubscribe_strcpy_SID(p_01,Param->SubsId);
    UVar1 = Param->Handle;
    pUVar3 = UpnpEventSubscribe_get_SID(p_01);
    iVar2 = genaUnSubscribe(UVar1,pUVar3);
    UpnpEventSubscribe_set_ErrCode(p_01,iVar2);
    UpnpEventSubscribe_strcpy_PublisherUrl(p_01,"");
    UpnpEventSubscribe_set_TimeOut(p_01,0);
    pcVar4 = Param->Cookie;
    UStack_40 = UPNP_EVENT_UNSUBSCRIBE_COMPLETE;
    goto LAB_0010ff4b;
  case ACTION:
    p = UpnpActionComplete_new();
    actionResult = (IXML_Document *)0x0;
    pcVar4 = Param->Url;
    if (Param->Header == (IXML_Document *)0x0) {
      iVar2 = SoapSendAction(pcVar4,Param->ServiceType,Param->Act,&actionResult);
    }
    else {
      iVar2 = SoapSendActionEx(pcVar4,Param->ServiceType,Param->Header,Param->Act,&actionResult);
    }
    UpnpActionComplete_set_ErrCode(p,iVar2);
    UpnpActionComplete_set_ActionRequest(p,Param->Act);
    UpnpActionComplete_set_ActionResult(p,actionResult);
    UpnpActionComplete_strcpy_CtrlUrl(p,pcVar4);
    (*Param->Fun)(UPNP_CONTROL_ACTION_COMPLETE,p,Param->Cookie);
    UpnpActionComplete_delete(p);
    ixmlDocument_free(actionResult);
    free_action_arg((job_arg *)Param);
    break;
  case STATUS:
    p_00 = UpnpStateVarComplete_new();
    actionResult = (IXML_Document *)0x0;
    iVar2 = SoapGetServiceVarStatus(Param->Url,Param->VarName,(char **)&actionResult);
    UpnpStateVarComplete_set_ErrCode(p_00,iVar2);
    UpnpStateVarComplete_strcpy_CtrlUrl(p_00,Param->Url);
    UpnpStateVarComplete_strcpy_StateVarName(p_00,Param->VarName);
    UpnpStateVarComplete_set_CurrentVal(p_00,(char *)actionResult);
    (*Param->Fun)(UPNP_CONTROL_GET_VAR_COMPLETE,p_00,Param->Cookie);
    free(Param);
    UpnpStateVarComplete_delete(p_00);
    break;
  case RENEW:
    p_01 = UpnpEventSubscribe_new();
    UpnpEventSubscribe_strcpy_SID(p_01,Param->SubsId);
    UVar1 = Param->Handle;
    pUVar3 = UpnpEventSubscribe_get_SID(p_01);
    iVar2 = genaRenewSubscription(UVar1,pUVar3,&Param->TimeOut);
    UpnpEventSubscribe_set_ErrCode(p_01,iVar2);
    UpnpEventSubscribe_set_TimeOut(p_01,Param->TimeOut);
    pcVar4 = Param->Cookie;
    UStack_40 = UPNP_EVENT_RENEWAL_COMPLETE;
LAB_0010ff4b:
    (*Param->Fun)(UStack_40,p_01,pcVar4);
LAB_0010ff55:
    UpnpEventSubscribe_delete(p_01);
    free(Param);
  }
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x101b,"Exiting UpnpThreadDistribution\n");
  return;
}

Assistant:

void UpnpThreadDistribution(struct UpnpNonblockParam *Param)
{
	int errCode = 0;

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpThreadDistribution \n");

	switch (Param->FunName) {
	#if EXCLUDE_GENA == 0
	case SUBSCRIBE: {
		UpnpEventSubscribe *evt = UpnpEventSubscribe_new();
		UpnpString *Sid = UpnpString_new();

		UpnpEventSubscribe_strcpy_PublisherUrl(evt, Param->Url);
		errCode = genaSubscribe(Param->Handle,
			UpnpEventSubscribe_get_PublisherUrl(evt),
			(int *)&Param->TimeOut,
			Sid);
		UpnpEventSubscribe_set_ErrCode(evt, errCode);
		UpnpEventSubscribe_set_TimeOut(evt, Param->TimeOut);
		UpnpEventSubscribe_set_SID(evt, Sid);
		Param->Fun(UPNP_EVENT_SUBSCRIBE_COMPLETE, evt, Param->Cookie);
		UpnpString_delete(Sid);
		UpnpEventSubscribe_delete(evt);
		free(Param);
		break;
	}
	case UNSUBSCRIBE: {
		UpnpEventSubscribe *evt = UpnpEventSubscribe_new();
		UpnpEventSubscribe_strcpy_SID(evt, Param->SubsId);
		errCode = genaUnSubscribe(
			Param->Handle, UpnpEventSubscribe_get_SID(evt));
		UpnpEventSubscribe_set_ErrCode(evt, errCode);
		UpnpEventSubscribe_strcpy_PublisherUrl(evt, "");
		UpnpEventSubscribe_set_TimeOut(evt, 0);
		Param->Fun(UPNP_EVENT_UNSUBSCRIBE_COMPLETE, evt, Param->Cookie);
		UpnpEventSubscribe_delete(evt);
		free(Param);
		break;
	}
	case RENEW: {
		UpnpEventSubscribe *evt = UpnpEventSubscribe_new();
		UpnpEventSubscribe_strcpy_SID(evt, Param->SubsId);
		errCode = genaRenewSubscription(Param->Handle,
			UpnpEventSubscribe_get_SID(evt),
			&Param->TimeOut);
		UpnpEventSubscribe_set_ErrCode(evt, errCode);
		UpnpEventSubscribe_set_TimeOut(evt, Param->TimeOut);
		Param->Fun(UPNP_EVENT_RENEWAL_COMPLETE, evt, Param->Cookie);
		UpnpEventSubscribe_delete(evt);
		free(Param);
		break;
	}
	#endif /* EXCLUDE_GENA == 0 */
	#if EXCLUDE_SOAP == 0
	case ACTION: {
		UpnpActionComplete *Evt = UpnpActionComplete_new();
		IXML_Document *actionResult = NULL;
		int errCode;
		if (Param->Header) {
			errCode = SoapSendActionEx(Param->Url,
				Param->ServiceType,
				Param->Header,
				Param->Act,
				&actionResult);
		} else {
			errCode = SoapSendAction(Param->Url,
				Param->ServiceType,
				Param->Act,
				&actionResult);
		}
		UpnpActionComplete_set_ErrCode(Evt, errCode);
		UpnpActionComplete_set_ActionRequest(Evt, Param->Act);
		UpnpActionComplete_set_ActionResult(Evt, actionResult);
		UpnpActionComplete_strcpy_CtrlUrl(Evt, Param->Url);
		Param->Fun(UPNP_CONTROL_ACTION_COMPLETE, Evt, Param->Cookie);
		UpnpActionComplete_delete(Evt);
		ixmlDocument_free(actionResult);
		free_action_arg((job_arg *)Param);
		break;
	}
	case STATUS: {
		UpnpStateVarComplete *Evt = UpnpStateVarComplete_new();
		DOMString currentVal = NULL;
		int errCode = SoapGetServiceVarStatus(
			Param->Url, Param->VarName, &currentVal);
		UpnpStateVarComplete_set_ErrCode(Evt, errCode);
		UpnpStateVarComplete_strcpy_CtrlUrl(Evt, Param->Url);
		UpnpStateVarComplete_strcpy_StateVarName(Evt, Param->VarName);
		UpnpStateVarComplete_set_CurrentVal(Evt, currentVal);
		Param->Fun(UPNP_CONTROL_GET_VAR_COMPLETE, Evt, Param->Cookie);
		free(Param);
		UpnpStateVarComplete_delete(Evt);
		break;
	}
	#endif /* EXCLUDE_SOAP == 0 */
	default:
		break;
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpThreadDistribution\n");
}